

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

token * get_next_token(Source_File *src,automata_entry *start_state,char skip_new_line)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  KEYWORDS KVar7;
  char cVar8;
  token *ptVar9;
  KEYWORDS kw;
  automata_entry *paVar10;
  automata_entry *paVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  skip_white_space(src,skip_new_line);
  src->token_size = 0;
  src->best_token_size = 0;
  uVar1 = src->which_column;
  uVar4 = src->which_row;
  auVar12._8_4_ = (int)uVar1;
  auVar12._0_8_ = uVar4;
  auVar12._12_4_ = (int)((ulong)uVar1 >> 0x20);
  src->best_token_line = uVar4;
  src->best_token_column = auVar12._8_8_;
  src->best_token_where_in_src_end = src->where_in_src;
  src->best_token_where_in_src_start = src->where_in_src;
  cVar8 = src_getc(src,'\x01','\0','\0');
  paVar11 = start_state;
  if (cVar8 != '\0') {
    paVar10 = start_state;
    do {
      if (cVar8 == '\n' && skip_new_line == '\0') break;
      paVar10 = paVar10->delta[cmpr[cVar8]];
      if (paVar10 == (automata_entry *)0x0) {
        kw = paVar11->type;
        if ((kw != PKW_COMMENT) && (kw != KW_COMMENT)) goto LAB_00145ea8;
        src->token_size = 0;
        src->best_token_size = 0;
        uVar3 = src->which_column;
        uVar6 = src->which_row;
        auVar14._8_4_ = (int)uVar3;
        auVar14._0_8_ = uVar6;
        auVar14._12_4_ = (int)((ulong)uVar3 >> 0x20);
        src->best_token_line = uVar6;
        src->best_token_column = auVar14._8_8_;
        src->where_in_src = src->best_token_where_in_src_end;
        src->best_token_where_in_src_start = src->best_token_where_in_src_end;
        skip_white_space(src,'\x01');
        paVar10 = start_state;
        paVar11 = start_state;
      }
      else if (paVar10->is_final != '\0') {
        uVar2 = src->which_row;
        uVar5 = src->token_size;
        auVar13._8_4_ = (int)uVar2;
        auVar13._0_8_ = uVar5;
        auVar13._12_4_ = (int)((ulong)uVar2 >> 0x20);
        src->best_token_size = uVar5;
        src->best_token_line = auVar13._8_8_;
        src->best_token_column = src->which_column;
        src->best_token_where_in_src_end = src->where_in_src;
        src->best_token_beg_line = src->is_in_the_begining_of_line;
        paVar11 = paVar10;
      }
      cVar8 = src_getc(src,'\x01','\0','\0');
    } while (cVar8 != '\0');
  }
  KVar7 = paVar11->type;
  kw = KW_NOTYPE;
  if ((KVar7 != KW_COMMENT) && (KVar7 != PKW_COMMENT)) {
    kw = KVar7;
  }
LAB_00145ea8:
  ptVar9 = src_extract_token(src,kw);
  return ptVar9;
}

Assistant:

struct token* get_next_token(struct Source_File *src,struct automata_entry *start_state,char skip_new_line)
{
	int temp;
	char hold_char;

	struct token *ret;
	struct automata_entry *current_state;
	struct automata_entry *best_state;

	/*ignore leading spaces,tabs and newlines*/
	skip_white_space(src,skip_new_line);

	src_reset_token_data(src,1);

	best_state=current_state=start_state;


	while( (hold_char=src_getc(src,1,0,0)) !='\0')
	{
		if(hold_char=='\n' && !skip_new_line)
		{
			break;
		}
		current_state=current_state->delta[cmpr[hold_char]];
		if(current_state==NULL)
		{
			if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
			{
				/*TODO account for new lines not counted in comment*/
				src_reset_token_data(src,0);
				best_state=current_state=start_state;
				skip_white_space(src,1);
			}else
			{
				return src_extract_token(src,best_state->type);
			}

		}else
		{
			if(current_state->is_final)
			{
				best_state=current_state;
				src_assimilate_into_best_token(src);
			}
		}
	}

	if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
	{
		return src_extract_token(src,KW_NOTYPE);
	}else
	{
		return src_extract_token(src,best_state->type);
	}
	return ret;
}